

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O2

void prng_add_entropy(prng *pr,uint source_id,ptrlen data)

{
  long *plVar1;
  uint uVar2;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var3;
  uint64_t uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  uchar buf [114];
  
  if (0x10 < source_id) {
    __assert_fail("source_id < NOISE_MAX_SOURCES",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/prng.c",
                  0xf4,"void prng_add_entropy(prng *, unsigned int, ptrlen)");
  }
  uVar2 = *(int *)((long)&pr[2].binarysink_[0].write + (ulong)source_id * 4) + 1;
  *(uint *)((long)&pr[2].binarysink_[0].write + (ulong)source_id * 4) = uVar2;
  uVar6 = 0;
  for (; (uVar6 < 0x1f && ((uVar2 & 1) == 0)); uVar2 = uVar2 >> 1) {
    uVar6 = uVar6 + 1;
  }
  BinarySink_put_datapl(*(BinarySink **)((&pr[4].binarysink_[0].writefmtv)[uVar6] + 8),data);
  p_Var3 = pr[0xc].binarysink_[0].writefmtv;
  if (uVar6 == 0) {
    bVar7 = p_Var3 < (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)data.len;
    p_Var3 = p_Var3 + -(long)data.len;
    if (bVar7) {
      p_Var3 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
    }
    pr[0xc].binarysink_[0].writefmtv = p_Var3;
  }
  if (p_Var3 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
    uVar4 = prng_reseed_time_ms();
    if (99 < uVar4 - pr[0xd].savesize) {
      prng_seed_begin(pr);
      uVar2 = *(int *)&pr[0xc].binarysink_[0].binarysink_ + 1;
      *(uint *)&pr[0xc].binarysink_[0].binarysink_ = uVar2;
      for (lVar5 = 0x12; lVar5 != 0x32; lVar5 = lVar5 + 1) {
        plVar1 = *(long **)((long)pr->binarysink_ + lVar5 * 8 + -8);
        (**(code **)(*plVar1 + 0x18))(plVar1,buf);
        BinarySink_put_data(pr->binarysink_,buf,*(size_t *)(pr[1].savesize + 0x28));
        (**(code **)(**(long **)((long)pr->binarysink_ + lVar5 * 8 + -8) + 8))();
        if ((uVar2 & 1) != 0) break;
        uVar2 = uVar2 >> 1;
      }
      smemclr(buf,0x72);
      prng_seed_finish(pr);
    }
  }
  return;
}

Assistant:

void prng_add_entropy(prng *pr, unsigned source_id, ptrlen data)
{
    prng_impl *pi = container_of(pr, prng_impl, Prng);

    assert(source_id < NOISE_MAX_SOURCES);
    uint32_t counter = ++pi->source_counters[source_id];

    size_t index = 0;
    while (index+1 < NCOLLECTORS && !(counter & 1)) {
        counter >>= 1;
        index++;
    }

    prngdebug("prng_add_entropy source=%u size=%"SIZEu" -> collector %zi\n",
              source_id, data.len, index);

    put_datapl(pi->collectors[index], data);

    if (index == 0)
        pi->until_reseed = (pi->until_reseed < data.len ? 0 :
                            pi->until_reseed - data.len);

    if (pi->until_reseed == 0 &&
        prng_reseed_time_ms() - pi->last_reseed_time >= 100) {
        prng_seed_begin(&pi->Prng);

        unsigned char buf[MAX_HASH_LEN];
        uint32_t reseed_index = ++pi->reseeds;
        prngdebug("prng entropy reseed #%"PRIu32"\n", reseed_index);
        for (size_t i = 0; i < NCOLLECTORS; i++) {
            prngdebug("emptying collector %"SIZEu"\n", i);
            ssh_hash_digest(pi->collectors[i], buf);
            put_data(&pi->Prng, buf, pi->hashalg->hlen);
            ssh_hash_reset(pi->collectors[i]);
            if (reseed_index & 1)
                break;
            reseed_index >>= 1;
        }
        smemclr(buf, sizeof(buf));
        prng_seed_finish(&pi->Prng);
    }
}